

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O3

PivotColumnEntry *
duckdb::PivotColumnEntry::Deserialize
          (PivotColumnEntry *__return_storage_ptr__,Deserializer *deserializer)

{
  uint uVar1;
  int iVar2;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var3;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var4;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_50;
  undefined8 local_48;
  undefined1 local_40;
  
  (__return_storage_ptr__->values).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->expr).
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0;
  (__return_storage_ptr__->values).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->values).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->alias)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->alias).field_2;
  (__return_storage_ptr__->alias)._M_string_length = 0;
  (__return_storage_ptr__->alias).field_2._M_local_buf[0] = '\0';
  Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::Value,true>>
            (deserializer,100,"values",&__return_storage_ptr__->values);
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x65,"star_expr");
  if ((char)uVar1 == '\0') {
    _Var3._M_head_impl =
         (__return_storage_ptr__->expr).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (__return_storage_ptr__->expr).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0
    ;
  }
  else {
    iVar2 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar2 == '\0') {
      _Var4._M_head_impl = (ParsedExpression *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      ParsedExpression::Deserialize((ParsedExpression *)&local_50,deserializer);
      _Var4._M_head_impl = local_50._M_head_impl;
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    _Var3._M_head_impl =
         (__return_storage_ptr__->expr).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (__return_storage_ptr__->expr).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = _Var4._M_head_impl;
  }
  if (_Var3._M_head_impl != (ParsedExpression *)0x0) {
    (**(code **)((long)((_Var3._M_head_impl)->super_BaseExpression)._vptr_BaseExpression + 8))();
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar1 & 0xff));
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x66,"alias");
  if ((char)uVar1 == '\0') {
    local_48._0_1_ = INVALID;
    local_48._1_1_ = INVALID;
    local_48._2_6_ = 0;
    local_40 = 0;
    local_50._M_head_impl = (ParsedExpression *)&local_40;
    ::std::__cxx11::string::operator=((string *)&__return_storage_ptr__->alias,(string *)&local_50);
    if (local_50._M_head_impl == (ParsedExpression *)&local_40) goto LAB_0174cc37;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)&__return_storage_ptr__->alias,(string *)&local_50);
    if (local_50._M_head_impl == (ParsedExpression *)&local_40) goto LAB_0174cc37;
  }
  operator_delete(local_50._M_head_impl);
LAB_0174cc37:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar1 & 0xff));
  return __return_storage_ptr__;
}

Assistant:

PivotColumnEntry PivotColumnEntry::Deserialize(Deserializer &deserializer) {
	PivotColumnEntry result;
	deserializer.ReadPropertyWithDefault<vector<Value>>(100, "values", result.values);
	deserializer.ReadPropertyWithDefault<unique_ptr<ParsedExpression>>(101, "star_expr", result.expr);
	deserializer.ReadPropertyWithDefault<string>(102, "alias", result.alias);
	return result;
}